

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlossySpecular.h
# Opt level: O0

RGBColor __thiscall
pm::GlossySpecular::f(GlossySpecular *this,ShadeRecord *sr,Vector3 *wi,Vector3 *wo)

{
  Vector3 *in_R8;
  ulong uVar1;
  ulong extraout_XMM0_Qa;
  float fVar2;
  RGBColor RVar3;
  pm local_80 [12];
  RGBColor local_74;
  float local_68;
  pm local_64 [4];
  float rDotWo;
  Vector3 local_58;
  Vector3 local_4c;
  undefined1 local_40 [8];
  Vector3 r;
  float nDotWi;
  Vector3 *wo_local;
  Vector3 *wi_local;
  ShadeRecord *sr_local;
  GlossySpecular *this_local;
  RGBColor *L;
  
  unique0x1000018d = in_R8;
  RGBColor::RGBColor((RGBColor *)this);
  r.y = dot((Vector3 *)&wi[3].y,wo);
  Vector3::operator-(&local_4c);
  operator*(local_64,2.0,(Vector3 *)&wi[3].y);
  Vector3::operator*(&local_58,r.y);
  Vector3::operator+((Vector3 *)local_40,&local_4c);
  local_68 = dot((Vector3 *)local_40,stack0xffffffffffffffd0);
  uVar1 = (ulong)(uint)local_68;
  fVar2 = 0.0;
  if (0.0 < local_68) {
    operator*(local_80,(sr->localHitPoint).y,(RGBColor *)&(sr->localHitPoint).z);
    fVar2 = powf(local_68,(sr->normal).z);
    RVar3 = RGBColor::operator*(&local_74,fVar2);
    fVar2 = RVar3.b;
    RGBColor::operator=((RGBColor *)this,&local_74);
    uVar1 = extraout_XMM0_Qa;
  }
  RVar3.b = fVar2;
  RVar3.r = (float)(int)uVar1;
  RVar3.g = (float)(int)(uVar1 >> 0x20);
  return RVar3;
}

Assistant:

inline RGBColor GlossySpecular::f(const ShadeRecord &sr, const Vector3 &wi, const Vector3 &wo) const
{
	RGBColor L;
	const float nDotWi = dot(sr.normal, wi);
	Vector3 r(-wi + 2.0f * sr.normal * nDotWi);
	const float rDotWo = dot(r, wo);

	if (rDotWo > 0.0f)
		L = ks_ * cs_ * powf(rDotWo, exp_);

	return L;
}